

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexWriter.cpp
# Opt level: O3

void __thiscall
Ptex::v2_4::PtexWriterBase::writeReduction
          (PtexWriterBase *this,FILE *fp,void *data,int stride,Res res)

{
  int iVar1;
  uint uVar2;
  ReduceFn *pRVar3;
  void *pvVar4;
  FILE *fp_00;
  undefined1 *data_00;
  byte bVar5;
  byte bVar6;
  uint size;
  void **ppvVar7;
  undefined6 in_register_00000082;
  void *local_48;
  FILE *local_40;
  undefined4 local_38;
  int local_34;
  
  ppvVar7 = &local_48;
  local_48 = data;
  bVar5 = res.ulog2 - 1;
  local_40 = fp;
  local_38 = (int)CONCAT62(in_register_00000082,res);
  iVar1 = this->_pixelSize;
  size = ((1 << (bVar5 & 0x1f)) << (res.vlog2 - 1U & 0x1f)) * iVar1;
  if ((int)size < 0x4001) {
    ppvVar7 = (void **)((long)&local_48 - ((long)(int)size + 0xfU & 0xfffffffffffffff0));
    data_00 = (undefined1 *)ppvVar7;
  }
  else {
    local_34 = stride;
    data_00 = (undefined1 *)operator_new__((ulong)size);
    stride = local_34;
  }
  pvVar4 = local_48;
  bVar6 = (byte)local_38;
  uVar2 = (this->_header).datatype;
  *(ulong *)((long)ppvVar7 + -8) = (ulong)(this->_header).nchannels;
  *(ulong *)((long)ppvVar7 + -0x10) = (ulong)uVar2;
  pRVar3 = this->_reduceFn;
  *(undefined8 *)((long)ppvVar7 + -0x18) = 0x110772;
  (*pRVar3)(pvVar4,stride,1 << (bVar6 & 0x1f),1 << (res.vlog2 & 0x1fU),data_00,
            iVar1 << (bVar5 & 0x1f),*(DataType *)((long)ppvVar7 + -0x10),
            *(int *)((long)ppvVar7 + -8));
  fp_00 = local_40;
  *(undefined8 *)((long)ppvVar7 + -8) = 0x110787;
  writeBlock(this,fp_00,data_00,size);
  if (0x4000 < (int)size) {
    *(undefined8 *)((long)ppvVar7 + -8) = 0x110797;
    operator_delete__(data_00);
  }
  return;
}

Assistant:

void PtexWriterBase::writeReduction(FILE* fp, const void* data, int stride, Res res)
{
    // reduce and write to file
    Ptex::Res newres((int8_t)(res.ulog2-1), (int8_t)(res.vlog2-1));
    int buffsize = newres.size() * _pixelSize;
    bool useNew = buffsize > AllocaMax;
    char* buff = useNew ? new char [buffsize] : (char*)alloca(buffsize);

    int dstride = newres.u() * _pixelSize;
    _reduceFn(data, stride, res.u(), res.v(), buff, dstride, datatype(), _header.nchannels);
    writeBlock(fp, buff, buffsize);

    if (useNew) delete [] buff;
}